

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O0

PatternBlock * TokenPattern::buildLittleBlock(int4 size,int4 bitstart,int4 bitend,intb value)

{
  int startbit_00;
  int iVar1;
  PatternBlock *pPVar2;
  PatternBlock *pPVar3;
  int iVar4;
  PatternBlock *newblock_1;
  PatternBlock *newblock;
  int4 endbit;
  int4 startbit;
  PatternBlock *block;
  PatternBlock *tmpblock;
  intb value_local;
  int4 bitend_local;
  int4 bitstart_local;
  int4 size_local;
  
  startbit_00 = (bitstart / 8) * 8;
  iVar1 = (bitend / 8) * 8;
  iVar4 = bitstart % 8;
  if (startbit_00 == iVar1) {
    pPVar2 = buildSingle((7 - bitend % 8) + startbit_00,(7 - iVar4) + iVar1,(uintm)value);
  }
  else {
    _endbit = buildSingle(startbit_00,startbit_00 + (7 - iVar4),(uintm)value);
    tmpblock = (PatternBlock *)(value >> (8U - (char)iVar4 & 0x3f));
    while( true ) {
      newblock._4_4_ = startbit_00 + 8;
      if (newblock._4_4_ == iVar1) break;
      pPVar3 = buildSingle(newblock._4_4_,startbit_00 + 0xf,(uintm)tmpblock);
      pPVar2 = pPVar3;
      if (_endbit != (PatternBlock *)0x0) {
        pPVar2 = PatternBlock::intersect(_endbit,pPVar3);
        if (_endbit != (PatternBlock *)0x0) {
          PatternBlock::~PatternBlock(_endbit);
          operator_delete(_endbit);
        }
        if (pPVar3 != (PatternBlock *)0x0) {
          PatternBlock::~PatternBlock(pPVar3);
          operator_delete(pPVar3);
        }
      }
      _endbit = pPVar2;
      tmpblock = (PatternBlock *)((long)tmpblock >> 8);
      startbit_00 = newblock._4_4_;
    }
    pPVar3 = buildSingle(iVar1 + (7 - bitend % 8),iVar1 + 7,(uintm)tmpblock);
    pPVar2 = pPVar3;
    if (_endbit != (PatternBlock *)0x0) {
      pPVar2 = PatternBlock::intersect(_endbit,pPVar3);
      if (_endbit != (PatternBlock *)0x0) {
        PatternBlock::~PatternBlock(_endbit);
        operator_delete(_endbit);
      }
      if (pPVar3 != (PatternBlock *)0x0) {
        PatternBlock::~PatternBlock(pPVar3);
        operator_delete(pPVar3);
      }
    }
  }
  _endbit = pPVar2;
  return _endbit;
}

Assistant:

PatternBlock *TokenPattern::buildLittleBlock(int4 size,int4 bitstart,int4 bitend,intb value)

{				// Build pattern block given a littleendian contiguous
				// range of bits and a value for those bits
  PatternBlock *tmpblock,*block;
  int4 startbit,endbit;

  block = (PatternBlock *)0;

  // we need to convert a bit range specified on a little endian token where the
  // bit indices label the least sig bit as 0 into a bit range on big endian bytes
  // where the indices label the most sig bit as 0.  The reversal due to
  // little->big endian cancels part of the reversal due to least->most sig bit
  // labelling, but not on the lower 3 bits.  So the transform becomes
  // leave the upper bits the same, but transform the lower 3-bit value x into 7-x.

  startbit = (bitstart/8) * 8;	// Get the high-order portion of little/LSB labelling
  endbit = (bitend/8) * 8;
  bitend = bitend % 8;		// Get the low-order portion of little/LSB labelling
  bitstart = bitstart % 8;

  if (startbit == endbit) {
    startbit += 7 - bitend;
    endbit += 7 - bitstart;
    block = buildSingle(startbit,endbit,(uintm)value);
  }
  else {
    block = buildSingle(startbit,startbit+(7-bitstart),(uintm)value);
    value >>= (8-bitstart);	// Cut off bits we just encoded
    startbit += 8;
    while(startbit != endbit) {
      tmpblock = buildSingle(startbit,startbit+7,(uintm)value);
      if (block == (PatternBlock *)0)
	block = tmpblock;
      else {
	PatternBlock *newblock = block->intersect(tmpblock);
	delete block;
	delete tmpblock;
	block = newblock;
      }
      value >>= 8;
      startbit += 8;
    }
    tmpblock = buildSingle(endbit+(7-bitend),endbit+7,(uintm)value);
    if (block == (PatternBlock *)0)
      block = tmpblock;
    else {
      PatternBlock *newblock = block->intersect(tmpblock);
      delete block;
      delete tmpblock;
      block = newblock;
    }
  }
  return block;
}